

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

QRectF * qvariant_cast<QRectF>(QVariant *v)

{
  long lVar1;
  bool bVar2;
  QMetaType to;
  QMetaType from;
  QRectF *pQVar3;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  QMetaType targetType;
  QMetaType in_stack_00000080;
  QMetaType in_stack_00000088;
  QVariant *in_stack_ffffffffffffffb8;
  QRectF *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  to = QMetaType::fromType<QRectF>();
  from = QVariant::Private::type((Private *)this);
  bVar2 = operator==((QMetaType *)this,(QMetaType *)in_stack_ffffffffffffffb8);
  if (bVar2) {
    pQVar3 = QVariant::Private::get<QRectF>((Private *)0x43d639);
    this->xp = pQVar3->xp;
    this->yp = pQVar3->yp;
    this->w = pQVar3->w;
    this->h = pQVar3->h;
  }
  else {
    this->xp = -NAN;
    this->yp = -NAN;
    this->w = -NAN;
    this->h = -NAN;
    QRectF::QRectF(this);
    QVariant::metaType(in_stack_ffffffffffffffb8);
    QVariant::constData((QVariant *)0x43d6af);
    QMetaType::convert(in_stack_00000088,from.d_ptr,in_stack_00000080,to.d_ptr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}